

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

void __thiscall ot::commissioner::UdpSocket::UdpSocket(UdpSocket *this,UdpSocket *aOther)

{
  UdpSocket *aOther_local;
  UdpSocket *this_local;
  
  Socket::Socket(&this->super_Socket,(aOther->super_Socket).mEventBase);
  (this->super_Socket)._vptr_Socket = (_func_int **)&PTR__UdpSocket_0046b670;
  *(undefined4 *)&(this->super_Socket).field_0xb4 =
       *(undefined4 *)&(aOther->super_Socket).field_0xb4;
  this->mIsBound = (bool)(aOther->mIsBound & 1);
  mbedtls_net_init((mbedtls_net_context *)&(aOther->super_Socket).field_0xb4);
  return;
}

Assistant:

UdpSocket::UdpSocket(UdpSocket &&aOther)
    : Socket(aOther.mEventBase)
    , mNetCtx(aOther.mNetCtx)
    , mIsBound(aOther.mIsBound)
{
    mbedtls_net_init(&aOther.mNetCtx);
}